

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O3

reference __thiscall
estl::vector_s<Rect,6ul>::emplace_back<unsigned_int,unsigned_int>
          (vector_s<Rect,6ul> *this,uint *args,uint *args_1)

{
  ulong uVar1;
  reference pvVar2;
  uint uVar3;
  range_error *this_00;
  
  uVar1 = *(long *)this + 1;
  if (uVar1 < 7) {
    pvVar2 = (reference)(*(long *)(this + 0x38) + *(long *)this * 8);
    uVar3 = *args_1;
    pvVar2->width_ = *args;
    pvVar2->height_ = uVar3;
    *(ulong *)this = uVar1;
    return pvVar2;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"cas::vector_s emplace_back beyond capacity.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

size_type     size        () const noexcept {   return size_;         }